

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::StringOneofFieldGenerator::StringOneofFieldGenerator
          (StringOneofFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  mapped_type *pmVar1;
  long lVar2;
  AlphaNum *a;
  allocator local_91;
  key_type local_90;
  key_type local_70;
  AlphaNum local_50;
  
  StringFieldGenerator::StringFieldGenerator(&this->super_StringFieldGenerator,descriptor,options);
  (this->super_StringFieldGenerator).super_FieldGenerator._vptr_FieldGenerator =
       (_func_int **)&PTR__StringOneofFieldGenerator_004da2e8;
  variables = &(this->super_StringFieldGenerator).super_FieldGenerator.variables_;
  SetCommonOneofFieldVariables(descriptor,variables);
  UnderscoresToCamelCase((string *)&local_50,*(string **)(descriptor + 8),true);
  std::__cxx11::string::string((string *)&local_90,"field_name",(allocator *)&local_70);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_90);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  if (((byte)descriptor[1] & 0x10) == 0) {
    lVar2 = 0;
  }
  else {
    lVar2 = *(long *)(descriptor + 0x28);
  }
  strings::AlphaNum::AlphaNum
            (&local_50,(int)((lVar2 - *(long *)(*(long *)(lVar2 + 0x10) + 0x30)) / 0x28));
  StrCat_abi_cxx11_(&local_90,(protobuf *)&local_50,a);
  std::__cxx11::string::string((string *)&local_70,"oneof_index",&local_91);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_70);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

StringOneofFieldGenerator::StringOneofFieldGenerator(
    const FieldDescriptor* descriptor, const Options& options)
    : StringFieldGenerator(descriptor, options) {
  SetCommonOneofFieldVariables(descriptor, &variables_);
  variables_["field_name"] = UnderscoresToCamelCase(descriptor->name(), true);
  variables_["oneof_index"] =
      StrCat(descriptor->containing_oneof()->index());
}